

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemReleaseExternal(Mem *p)

{
  ushort uVar1;
  
  uVar1 = p->flags;
  if ((uVar1 >> 0xd & 1) != 0) {
    sqlite3VdbeMemFinalize(p,(p->u).pDef);
    sqlite3VdbeMemRelease(p);
    return;
  }
  if (((uVar1 >> 10 & 1) == 0) || (p->xDel == (_func_void_void_ptr *)0x0)) {
    if ((uVar1 & 0x20) != 0) {
      sqlite3RowSetClear((p->u).pRowSet);
      return;
    }
    if ((uVar1 & 0x40) != 0) {
      sqlite3VdbeMemSetNull(p);
      return;
    }
  }
  else {
    (*p->xDel)(p->z);
    p->xDel = (_func_void_void_ptr *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemReleaseExternal(Mem *p){
  assert( p->db==0 || sqlite3_mutex_held(p->db->mutex) );
  if( p->flags&MEM_Agg ){
    sqlite3VdbeMemFinalize(p, p->u.pDef);
    assert( (p->flags & MEM_Agg)==0 );
    sqlite3VdbeMemRelease(p);
  }else if( p->flags&MEM_Dyn && p->xDel ){
    assert( (p->flags&MEM_RowSet)==0 );
    assert( p->xDel!=SQLITE_DYNAMIC );
    p->xDel((void *)p->z);
    p->xDel = 0;
  }else if( p->flags&MEM_RowSet ){
    sqlite3RowSetClear(p->u.pRowSet);
  }else if( p->flags&MEM_Frame ){
    sqlite3VdbeMemSetNull(p);
  }
}